

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O1

error_code __thiscall
slang::DiagnosticEngine::addIgnorePaths(DiagnosticEngine *this,string_view pattern)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  error_code ec;
  path p;
  path local_80;
  path local_58;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = pattern._M_str;
  local_30._M_len = pattern._M_len;
  uVar2 = std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_58,&local_30,auto_format);
  std::filesystem::weakly_canonical(&local_80,(error_code *)&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  emplace_back<std::filesystem::__cxx11::path>(&this->ignoreWarnPatterns,&local_80);
  std::filesystem::__cxx11::path::~path(&local_80);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return (error_code)(auVar1 << 0x40);
}

Assistant:

std::error_code DiagnosticEngine::addIgnorePaths(std::string_view pattern) {
    std::error_code ec;
    auto p = fs::weakly_canonical(pattern, ec);
    if (!ec)
        ignoreWarnPatterns.emplace_back(std::move(p));

    return ec;
}